

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Node **ppNVar1;
  uint uVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  bool bVar5;
  bool bVar6;
  Bool BVar7;
  int iVar8;
  Node *pNVar9;
  tmbstr ptVar10;
  Dict *pDVar11;
  Node *pNVar12;
  Node **ppNVar13;
  uint uVar14;
  GetTokenMode mode_00;
  TidyTagId TVar15;
  GetTokenMode local_3c;
  
  pDVar11 = element->tag;
  if ((pDVar11->model & 1) != 0) {
    return;
  }
  pLVar3 = doc->lexer;
  if ((pDVar11 != (Dict *)0x0 && element != (Node *)0x0) && (pDVar11->id == TidyTag_FORM)) {
    for (pNVar9 = element->parent; pNVar9 != (Node *)0x0; pNVar9 = pNVar9->parent) {
      if ((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_FORM)) {
        prvTidyReport(doc,element,(Node *)0x0,0x243);
        break;
      }
    }
  }
  uVar2 = element->tag->model;
  uVar14 = 0;
  if ((uVar2 >> 0xb & 1) != 0) {
    uVar14 = pLVar3->istackbase;
    pLVar3->istackbase = pLVar3->istacksize;
  }
  if ((uVar2 >> 0x11 & 1) == 0) {
    prvTidyInlineDup(doc,(Node *)0x0);
  }
  mode_00 = IgnoreWhitespace;
  if ((element->tag->model & 0x410) == 0x10) {
    mode_00 = mode + (mode == IgnoreWhitespace);
  }
  pNVar9 = prvTidyGetToken(doc,mode_00);
  if (pNVar9 != (Node *)0x0) {
    ppNVar1 = &element->content;
    bVar5 = true;
    do {
      if (((pNVar9->type == EndTag) && (pDVar11 = pNVar9->tag, pDVar11 != (Dict *)0x0)) &&
         ((pDVar11 == element->tag || (element->was == pDVar11)))) {
        prvTidyFreeNode(doc,pNVar9);
        if ((element->tag->model & 0x800) != 0) {
          while (pLVar3->istackbase < pLVar3->istacksize) {
            prvTidyPopInline(doc,(Node *)0x0);
          }
          pLVar3->istackbase = uVar14;
        }
        element->closed = yes;
        goto LAB_0013e905;
      }
      pDVar11 = pNVar9->tag;
      if ((pDVar11 == (Dict *)0x0) ||
         ((pDVar11->id != TidyTag_HTML &&
          ((pDVar11 == (Dict *)0x0 ||
           ((pDVar11->id != TidyTag_HEAD &&
            ((pDVar11 == (Dict *)0x0 || (pDVar11->id != TidyTag_BODY)))))))))) {
        if (pNVar9->type != EndTag) goto LAB_0013e11e;
        if (pDVar11 == (Dict *)0x0) goto LAB_0013e43f;
        TVar15 = pDVar11->id;
        if (TVar15 != TidyTag_P) {
          if (TVar15 == TidyTag_BR) {
            pNVar9->type = StartTag;
            goto LAB_0013e11e;
          }
          for (pNVar12 = element->parent; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->parent) {
            if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TVar15)) {
              prvTidyUngetToken(doc);
              goto LAB_0013e862;
            }
          }
          if ((pLVar3->exiled == no) ||
             ((BVar7 = prvTidynodeHasCM(pNVar9,0x80), BVar7 == no &&
              ((pNVar9->tag == (Dict *)0x0 || (pNVar9->tag->id != TidyTag_TABLE))))))
          goto LAB_0013e11e;
LAB_0013e81c:
          prvTidyUngetToken(doc);
          goto LAB_0013e905;
        }
        pNVar9->type = StartEndTag;
        pNVar9->implicit = yes;
LAB_0013e11e:
        BVar7 = prvTidynodeIsText(pNVar9);
        if (BVar7 == no) {
          BVar7 = InsertMisc(element,pNVar9);
          if (BVar7 == no) {
            pDVar11 = pNVar9->tag;
            if (pDVar11 != (Dict *)0x0) {
              if (pDVar11->id == TidyTag_PARAM) {
                BVar7 = prvTidynodeHasCM(element,0x1000);
                if (BVar7 != no) {
LAB_0013e220:
                  BVar7 = prvTidynodeIsElement(pNVar9);
                  if (BVar7 != no) {
                    pNVar9->parent = element;
                    pNVar12 = element->last;
                    pNVar9->prev = pNVar12;
                    ppNVar13 = &pNVar12->next;
                    if (pNVar12 == (Node *)0x0) {
                      ppNVar13 = ppNVar1;
                    }
                    *ppNVar13 = pNVar9;
                    element->last = pNVar9;
                    goto LAB_0013e45f;
                  }
                }
              }
              else if (pDVar11 != (Dict *)0x0) {
                if (pDVar11->id == TidyTag_AREA) {
                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                     (element->tag->id == TidyTag_MAP)) goto LAB_0013e220;
                }
                else if (pDVar11 != (Dict *)0x0) {
                  BVar7 = prvTidynodeHasCM(pNVar9,0x10);
                  if (BVar7 == no) {
                    BVar7 = prvTidynodeIsElement(pNVar9);
                    if (BVar7 == no) {
                      if ((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_FORM)) {
                        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
                      }
                      goto LAB_0013e43f;
                    }
                    if ((element == (Node *)0x0) || (pDVar11 = element->tag, pDVar11 == (Dict *)0x0)
                       ) {
LAB_0013e407:
                      BVar7 = prvTidynodeHasCM(pNVar9,8);
                      if (BVar7 == no) {
                        pDVar11 = pNVar9->tag;
                        if ((pDVar11->model & 4) != 0) {
LAB_0013e66e:
                          MoveToHead(doc,element,pNVar9);
                          goto LAB_0013e45f;
                        }
                        if ((((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                              (element->tag->id == TidyTag_FORM)) &&
                             ((pNVar12 = element->parent, pNVar12 != (Node *)0x0 &&
                              (pNVar12->tag != (Dict *)0x0)))) && (pNVar12->tag->id == TidyTag_TD))
                           && ((pNVar12->implicit != no && (pDVar11 != (Dict *)0x0)))) {
                          if (pDVar11->id == TidyTag_TD) goto LAB_0013e43f;
                          if ((pDVar11 != (Dict *)0x0) && (pDVar11->id == TidyTag_TH)) {
                            prvTidyReport(doc,element,pNVar9,0x235);
                            prvTidyFreeNode(doc,pNVar9);
                            pNVar9 = element->parent;
                            (*doc->allocator->vtbl->free)(doc->allocator,pNVar9->element);
                            ptVar10 = prvTidytmbstrdup(doc->allocator,"th");
                            pNVar9->element = ptVar10;
                            pDVar11 = prvTidyLookupTagDef(TidyTag_TH);
                            pNVar9->tag = pDVar11;
                            goto LAB_0013e45f;
                          }
                        }
                        BVar7 = prvTidynodeHasCM(element,0x8000);
                        if ((BVar7 == no) && (element->implicit == no)) {
                          prvTidyReport(doc,element,pNVar9,0x259);
                        }
                        if ((*(int *)((doc->config).value + 0x3b) == 0) &&
                           (BVar7 = prvTidynodeHasCM(element,0x8000), BVar7 != no)) {
                          prvTidyReport(doc,element,pNVar9,0x25b);
                        }
                        prvTidyUngetToken(doc);
                        BVar7 = prvTidynodeHasCM(pNVar9,0x20);
                        if (BVar7 == no) {
                          BVar7 = prvTidynodeHasCM(pNVar9,0x40);
                          if (BVar7 == no) {
                            BVar7 = prvTidynodeHasCM(pNVar9,0x80);
                            if ((BVar7 == no) &&
                               (BVar7 = prvTidynodeHasCM(pNVar9,0x200), BVar7 == no)) {
                              BVar7 = prvTidynodeHasCM(element,0x800);
                              if (BVar7 != no) goto LAB_0013e99a;
                              goto LAB_0013e905;
                            }
                            if (pLVar3->exiled != no) {
                              return;
                            }
                            TVar15 = TidyTag_TABLE;
                          }
                          else {
                            if (((element->parent != (Node *)0x0) &&
                                (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
                               (pDVar11->id == TidyTag_DL)) goto LAB_0013e905;
                            TVar15 = TidyTag_DL;
                          }
                          pNVar9 = prvTidyInferredTag(doc,TVar15);
                          goto LAB_0013e29e;
                        }
                        if (((element->parent != (Node *)0x0) &&
                            (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
                           (pDVar11->parser == prvTidyParseList)) goto LAB_0013e905;
                        pNVar9 = prvTidyInferredTag(doc,TidyTag_UL);
                        AddClassNoIndent(doc,pNVar9);
                      }
                      else if (pLVar3->excludeBlocks != no) {
                        BVar7 = prvTidynodeHasCM(element,0x8000);
                        if (BVar7 == no) {
                          prvTidyReport(doc,element,pNVar9,0x259);
                        }
                        prvTidyUngetToken(doc);
                        BVar7 = prvTidynodeHasCM(element,0x800);
                        if (BVar7 != no) goto LAB_0013e8fa;
                        goto LAB_0013e905;
                      }
                    }
                    else {
                      if (((pDVar11->id == TidyTag_LI) &&
                          (pDVar4 = pNVar9->tag, pDVar4 != (Dict *)0x0)) &&
                         ((pDVar4->id == TidyTag_FRAME ||
                          ((pDVar4 != (Dict *)0x0 &&
                           ((pDVar4->id == TidyTag_FRAMESET ||
                            ((pDVar4 != (Dict *)0x0 &&
                             ((pDVar4->id == TidyTag_OPTGROUP ||
                              ((pDVar4 != (Dict *)0x0 && (pDVar4->id == TidyTag_OPTION))))))))))))))
                      goto LAB_0013e43f;
                      if ((pDVar11 == (Dict *)0x0) ||
                         ((pDVar11->id != TidyTag_TD &&
                          ((pDVar11 == (Dict *)0x0 || (pDVar11->id != TidyTag_TH))))))
                      goto LAB_0013e407;
                      BVar7 = prvTidynodeHasCM(pNVar9,4);
                      if (BVar7 != no) goto LAB_0013e66e;
                      BVar7 = prvTidynodeHasCM(pNVar9,0x20);
                      if (BVar7 == no) {
                        BVar7 = prvTidynodeHasCM(pNVar9,0x40);
                        if (BVar7 != no) {
                          prvTidyUngetToken(doc);
                          pNVar9 = prvTidyInferredTag(doc,TidyTag_DL);
                          goto LAB_0013e7ff;
                        }
                      }
                      else {
                        prvTidyUngetToken(doc);
                        pNVar9 = prvTidyInferredTag(doc,TidyTag_UL);
                        AddClassNoIndent(doc,pNVar9);
LAB_0013e7ff:
                        pLVar3->excludeBlocks = yes;
                      }
                      BVar7 = prvTidynodeHasCM(pNVar9,8);
                      if (BVar7 == no) goto LAB_0013e81c;
                    }
                  }
LAB_0013e29e:
                  if ((((pNVar9 != (Node *)0x0) && (pNVar9->tag != (Dict *)0x0)) &&
                      (pNVar9->tag->id == TidyTag_A)) && (pNVar9->implicit == no)) {
                    if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                       (element->tag->id == TidyTag_A)) {
LAB_0013e585:
                      if ((pNVar9->type != EndTag) &&
                         ((pNVar9->attributes == (AttVal *)0x0 &&
                          (*(int *)((doc->config).value + 9) != 0)))) {
                        pNVar9->type = EndTag;
                        prvTidyReport(doc,element,pNVar9,0x232);
                        prvTidyUngetToken(doc);
                        goto LAB_0013e45f;
                      }
                      if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                         (element->tag->id != TidyTag_A)) {
                        prvTidyReport(doc,element,pNVar9,0x235);
                        prvTidyFreeNode(doc,pNVar9);
                      }
                      else {
                        prvTidyReport(doc,element,pNVar9,0x259);
                        prvTidyUngetToken(doc);
                      }
                      if ((mode_00 & Preformatted) != IgnoreWhitespace) {
                        return;
                      }
                      goto LAB_0013e905;
                    }
                    for (pNVar12 = element->parent; pNVar12 != (Node *)0x0;
                        pNVar12 = pNVar12->parent) {
                      if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TidyTag_A))
                      goto LAB_0013e585;
                    }
                  }
                  BVar7 = prvTidynodeIsElement(pNVar9);
                  if (BVar7 != no) {
                    if ((pNVar9->tag->model & 0x10) == 0) {
                      bVar5 = true;
                      local_3c = IgnoreWhitespace;
                    }
                    else if (bVar5) {
                      local_3c = MixedContent;
                      if (pNVar9->implicit == no) {
                        if ((element->tag->model & 0x20000) != 0) goto LAB_0013e5f8;
                        iVar8 = prvTidyInlineDup(doc,pNVar9);
                        bVar5 = false;
                        if (0 < iVar8) goto LAB_0013e45f;
                      }
                      else {
                        bVar5 = true;
                      }
                    }
                    else {
LAB_0013e5f8:
                      local_3c = MixedContent;
                      bVar5 = false;
                    }
                    if (((pNVar9 != (Node *)0x0) && (pNVar9->tag != (Dict *)0x0)) &&
                       (pNVar9->tag->id == TidyTag_BR)) {
                      TrimSpaces(doc,element);
                    }
                    pNVar9->parent = element;
                    pNVar12 = element->last;
                    pNVar9->prev = pNVar12;
                    ppNVar13 = &pNVar12->next;
                    if (pNVar12 == (Node *)0x0) {
                      ppNVar13 = ppNVar1;
                    }
                    *ppNVar13 = pNVar9;
                    element->last = pNVar9;
                    if (pNVar9->implicit != no) {
                      prvTidyReport(doc,element,pNVar9,0x247);
                    }
                    ParseTag(doc,pNVar9,IgnoreWhitespace);
                    mode_00 = local_3c;
                    goto LAB_0013e45f;
                  }
                  if (pNVar9->type == EndTag) {
                    prvTidyPopInline(doc,pNVar9);
                  }
                }
              }
            }
LAB_0013e43f:
            prvTidyReport(doc,element,pNVar9,0x235);
            goto LAB_0013e454;
          }
        }
        else {
          if ((bVar5) && ((element->tag->model & 0x20000) == 0)) {
            iVar8 = prvTidyInlineDup(doc,pNVar9);
            bVar5 = false;
            if (0 < iVar8) goto LAB_0013e45f;
          }
          pNVar9->parent = element;
          pNVar12 = element->last;
          ppNVar13 = &pNVar12->next;
          if (pNVar12 == (Node *)0x0) {
            ppNVar13 = ppNVar1;
          }
          bVar6 = false;
          pNVar9->prev = pNVar12;
          *ppNVar13 = pNVar9;
          element->last = pNVar9;
          mode_00 = MixedContent;
          bVar5 = false;
          if (((element != (Node *)0x0) &&
              (pDVar11 = element->tag, bVar5 = bVar6, pDVar11 != (Dict *)0x0)) &&
             ((pDVar11->id == TidyTag_BODY ||
              ((pDVar11 != (Dict *)0x0 &&
               ((pDVar11->id == TidyTag_MAP ||
                ((pDVar11 != (Dict *)0x0 &&
                 ((pDVar11->id == TidyTag_BLOCKQUOTE ||
                  ((pDVar11 != (Dict *)0x0 &&
                   ((pDVar11->id == TidyTag_FORM ||
                    ((pDVar11 != (Dict *)0x0 && (pDVar11->id == TidyTag_NOSCRIPT)))))))))))))))))) {
            prvTidyConstrainVersion(doc,0xfffffedb);
          }
        }
      }
      else {
        BVar7 = prvTidynodeIsElement(pNVar9);
        if (BVar7 != no) goto LAB_0013e43f;
LAB_0013e454:
        prvTidyFreeNode(doc,pNVar9);
      }
LAB_0013e45f:
      pNVar9 = prvTidyGetToken(doc,mode_00);
    } while (pNVar9 != (Node *)0x0);
  }
LAB_0013e862:
  if ((element->tag->model & 0x8000) == 0) {
    prvTidyReport(doc,element,pNVar9,0x25a);
  }
  if ((element->tag->model & 0x800) == 0) goto LAB_0013e905;
  while (pLVar3->istackbase < pLVar3->istacksize) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
LAB_0013e8fa:
  pLVar3->istackbase = uVar14;
LAB_0013e905:
  TrimSpaces(doc,element);
  return;
LAB_0013e99a:
  while (pLVar3->istackbase < pLVar3->istacksize) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
  goto LAB_0013e8fa;
}

Assistant:

void TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_block = 0;
    static int parse_block_cnt = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack = yes;
    uint istackbase = 0;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_block++;
    parse_block_cnt++;
    SPRTF("Entering ParseBlock %d... %d %s\n",in_parse_block,parse_block_cnt,
        ((element && element->element) ? element->element : ""));
#endif

    if ( element->tag->model & CM_EMPTY ) {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_block--;
        SPRTF("Exit ParseBlockL 1 %d...\n",in_parse_block);
#endif
        return;
    }

    if ( nodeIsFORM(element) && 
         DescendantOf(element, TidyTag_FORM) )
        TY_(Report)(doc, element, NULL, ILLEGAL_NESTING );

    /*
     InlineDup() asks the lexer to insert inline emphasis tags
     currently pushed on the istack, but take care to avoid
     propagating inline emphasis inside OBJECT or APPLET.
     For these elements a fresh inline stack context is created
     and disposed of upon reaching the end of the element.
     They thus behave like table cells in this respect.
    */
    if (element->tag->model & CM_OBJECT)
    {
        istackbase = lexer->istackbase;
        lexer->istackbase = lexer->istacksize;
    }

    if (!(element->tag->model & CM_MIXED))
        TY_(InlineDup)( doc, NULL );

    /*\
     *  Issue #212 - If it is likely that it may be necessary
     *  to move a leading space into a text node before this
     *  element, then keep the mode MixedContent to keep any
     *  leading space
    \*/
    if ( !(element->tag->model & CM_INLINE) ||
          (element->tag->model & CM_FIELD ) )
    {
        mode = IgnoreWhitespace;
    }
    else if (mode == IgnoreWhitespace)
    {
        /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
           when such a leading space may need to be inserted before this element to 
           preverve the browser view */
        mode = MixedContent;
    }

    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
            in_parse_block--;
            SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
            return;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /* 
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            mode = MixedContent;

            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 3 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 4 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else /* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                
                /* #521, warn on missing optional end-tags if not omitting them. */
                if ( cfgBool( doc, TidyOmitOptionalTags ) == no && TY_(nodeHasCM)(element, CM_OPT) )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_OPTIONAL );


                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 5 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 6 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can 
                       continue. */
                    if (lexer->exiled) {
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 7 %d...\n",in_parse_block);
#endif
                        return;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 8 %d...\n",in_parse_block);
#endif
                    return;

                }
                else
                {
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 9 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            else
            {
                /* Issue #597 - if we not 'UngetToken' then it is being discarded.
                   Add message, and 'FreeNode' - thanks @ralfjunker */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_block--;
            SPRTF("Exit ParseBlock 9b %d...\n",in_parse_block);
#endif
            return;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);
            
            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an 
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */
            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
    in_parse_block--;
    SPRTF("Exit ParseBlock 10 %d...\n",in_parse_block);
#endif
}